

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall crnlib::dynamic_string::append_char(dynamic_string *this,char c)

{
  ushort uVar1;
  uint new_buf_size;
  
  new_buf_size = this->m_len + 2;
  uVar1 = this->m_buf_size;
  if (uVar1 < new_buf_size && this->m_len < 0xfffe) {
    expand_buf(this,new_buf_size,true);
    uVar1 = this->m_buf_size;
  }
  if (new_buf_size <= uVar1) {
    this->m_pStr[this->m_len] = c;
    this->m_pStr[(ulong)this->m_len + 1] = '\0';
    this->m_len = this->m_len + 1;
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::append_char(char c)
    {
        if (ensure_buf(m_len + 1))
        {
            m_pStr[m_len] = c;
            m_pStr[m_len + 1] = '\0';
            m_len++;
            check();
        }

        return *this;
    }